

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O2

void __thiscall
TasGrid::Optimizer::CurrentNodes<(TasGrid::TypeOneDRule)15>::CurrentNodes
          (CurrentNodes<(TasGrid::TypeOneDRule)15> *this,
          vector<double,_std::allocator<double>_> *cnodes,double new_node)

{
  double local_38;
  _Vector_base<double,_std::allocator<double>_> local_30;
  
  local_38 = new_node;
  ::std::vector<double,_std::allocator<double>_>::vector(&this->nodes,cnodes);
  (this->coeff).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->coeff).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->coeff).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ::std::vector<double,_std::allocator<double>_>::push_back(&this->nodes,&local_38);
  makeCoefficients((vector<double,_std::allocator<double>_> *)&local_30,&this->nodes);
  ::std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->coeff,&local_30);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_30);
  return;
}

Assistant:

CurrentNodes(std::vector<double> const &cnodes, double new_node)
            : nodes(cnodes){
        nodes.push_back(new_node);
        coeff = makeCoefficients(nodes);
    }